

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_serializeNode(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  xmlDocPtr local_78;
  int options;
  xmlBufferPtr buf;
  xmlSaveCtxtPtr ctxt;
  undefined8 uStack_50;
  int format;
  char *encoding;
  xmlDocPtr doc;
  xmlNodePtr node;
  PyObject *pyobj_node;
  xmlChar *c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  c_retval = (xmlChar *)0x0;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Ozi:serializeNode",&node,&stack0xffffffffffffffb0,(long)&ctxt + 4);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (node == (xmlNodePtr)&_Py_NoneStruct) {
      local_78 = (xmlDocPtr)0x0;
    }
    else {
      local_78 = (xmlDocPtr)node->name;
    }
    doc = local_78;
    if (local_78 == (xmlDocPtr)0x0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      if (local_78->type == XML_DOCUMENT_NODE) {
        encoding = (char *)local_78;
        doc = (xmlDocPtr)0x0;
      }
      else if (local_78->type == XML_HTML_DOCUMENT_NODE) {
        encoding = (char *)local_78;
        doc = (xmlDocPtr)0x0;
      }
      else {
        if (local_78->type == XML_NAMESPACE_DECL) {
          encoding = (char *)0x0;
        }
        else {
          encoding = (char *)local_78->doc;
        }
        if (((encoding != (char *)0x0) && (*(int *)(encoding + 8) != 9)) &&
           (*(int *)(encoding + 8) != 0xd)) {
          _Py_INCREF((PyObject *)&_Py_NoneStruct);
          self_local = (PyObject *)&_Py_NoneStruct;
          return self_local;
        }
      }
      puVar2 = (undefined8 *)xmlBufferCreate();
      if (puVar2 == (undefined8 *)0x0) {
        _Py_INCREF((PyObject *)&_Py_NoneStruct);
        self_local = (PyObject *)&_Py_NoneStruct;
      }
      else {
        lVar3 = xmlSaveToBuffer(puVar2,uStack_50,ctxt._4_4_ != 0);
        if (lVar3 == 0) {
          xmlBufferFree(puVar2);
          _Py_INCREF((PyObject *)&_Py_NoneStruct);
          self_local = (PyObject *)&_Py_NoneStruct;
        }
        else {
          if (doc == (xmlDocPtr)0x0) {
            xmlSaveDoc(lVar3,encoding);
          }
          else {
            xmlSaveTree(lVar3,doc);
          }
          xmlSaveClose(lVar3);
          pyobj_node = (PyObject *)*puVar2;
          *puVar2 = 0;
          xmlBufferFree(puVar2);
          self_local = libxml_charPtrWrap((char *)pyobj_node);
        }
      }
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_serializeNode(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval = NULL;
    xmlChar *c_retval;
    PyObject *pyobj_node;
    xmlNodePtr node;
    xmlDocPtr doc;
    const char *encoding;
    int format;
    xmlSaveCtxtPtr ctxt;
    xmlBufferPtr buf;
    int options = 0;

    if (!PyArg_ParseTuple(args, (char *) "Ozi:serializeNode", &pyobj_node,
                          &encoding, &format))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);

    if (node == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    if (node->type == XML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
	node = NULL;
#ifdef LIBXML_HTML_ENABLED
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
	node = NULL;
#endif
    } else {
        if (node->type == XML_NAMESPACE_DECL)
	    doc = NULL;
	else
            doc = node->doc;
        if ((doc == NULL) || (doc->type == XML_DOCUMENT_NODE)) {
#ifdef LIBXML_HTML_ENABLED
        } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
#endif /* LIBXML_HTML_ENABLED */
        } else {
            Py_INCREF(Py_None);
            return (Py_None);
        }
    }


    buf = xmlBufferCreate();
    if (buf == NULL) {
	Py_INCREF(Py_None);
	return (Py_None);
    }
    if (format) options |= XML_SAVE_FORMAT;
    ctxt = xmlSaveToBuffer(buf, encoding, options);
    if (ctxt == NULL) {
	xmlBufferFree(buf);
	Py_INCREF(Py_None);
	return (Py_None);
    }
    if (node == NULL)
	xmlSaveDoc(ctxt, doc);
    else
	xmlSaveTree(ctxt, node);
    xmlSaveClose(ctxt);

    c_retval = buf->content;
    buf->content = NULL;

    xmlBufferFree(buf);
    py_retval = libxml_charPtrWrap((char *) c_retval);

    return (py_retval);
}